

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall
QFileDialogPrivate::setLabelTextControl(QFileDialogPrivate *this,DialogLabel label,QString *text)

{
  Ui_QFileDialog *pUVar1;
  int iVar2;
  QPushButton *this_00;
  StandardButton which;
  QLabel *this_01;
  QDialogButtonBox *this_02;
  
  pUVar1 = (this->qFileDialogUi).d;
  if (pUVar1 == (Ui_QFileDialog *)0x0) {
    return;
  }
  switch(label) {
  case LookIn:
    this_01 = pUVar1->lookInLabel;
    break;
  case FileName:
    this_01 = pUVar1->fileNameLabel;
    break;
  case FileType:
    this_01 = pUVar1->fileTypeLabel;
    break;
  case Accept:
    iVar2 = QFileDialogOptions::acceptMode();
    this_02 = (QDialogButtonBox *)((this->qFileDialogUi).d)->buttonBox;
    if (iVar2 == 0) {
      which = Open;
    }
    else {
      which = Save;
    }
    goto LAB_004df8cf;
  case Reject:
    this_02 = (QDialogButtonBox *)pUVar1->buttonBox;
    which = Cancel;
LAB_004df8cf:
    this_00 = QDialogButtonBox::button(this_02,which);
    if (this_00 != (QPushButton *)0x0) {
      QAbstractButton::setText(&this_00->super_QAbstractButton,text);
      return;
    }
switchD_004df864_default:
    return;
  default:
    goto switchD_004df864_default;
  }
  QLabel::setText(this_01,text);
  return;
}

Assistant:

bool operator!() const noexcept
    {
        return !d;
    }